

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

CURLcode Curl_http_proxy_get_destination
                   (Curl_cfilter *cf,char **phostname,int *pport,_Bool *pipv6_ip)

{
  connectdata *pcVar1;
  char *pcVar2;
  uint uVar3;
  _Bool _Var4;
  
  pcVar1 = cf->conn;
  if (((pcVar1->bits).field_0x1 & 1) == 0) {
    if (cf->sockindex != 1) {
      pcVar2 = (pcVar1->host).name;
      *phostname = pcVar2;
LAB_00138086:
      pcVar1 = cf->conn;
      if (((pcVar1->bits).field_0x1 & 2) == 0) {
        uVar3 = pcVar1->remote_port;
      }
      else {
        uVar3 = pcVar1->conn_to_port;
      }
      goto LAB_001380a1;
    }
    pcVar2 = pcVar1->secondaryhostname;
    *phostname = pcVar2;
  }
  else {
    pcVar2 = (pcVar1->conn_to_host).name;
    *phostname = pcVar2;
    if (cf->sockindex != 1) goto LAB_00138086;
  }
  pcVar1 = cf->conn;
  uVar3 = (uint)pcVar1->secondary_port;
LAB_001380a1:
  *pport = uVar3;
  if (pcVar2 == (pcVar1->host).name) {
    _Var4 = (_Bool)((byte)(*(uint *)&pcVar1->bits >> 10) & 1);
  }
  else {
    pcVar2 = strchr(pcVar2,0x3a);
    _Var4 = pcVar2 != (char *)0x0;
  }
  *pipv6_ip = _Var4;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_proxy_get_destination(struct Curl_cfilter *cf,
                                         const char **phostname,
                                         int *pport, bool *pipv6_ip)
{
  DEBUGASSERT(cf);
  DEBUGASSERT(cf->conn);

  if(cf->conn->bits.conn_to_host)
    *phostname = cf->conn->conn_to_host.name;
  else if(cf->sockindex == SECONDARYSOCKET)
    *phostname = cf->conn->secondaryhostname;
  else
    *phostname = cf->conn->host.name;

  if(cf->sockindex == SECONDARYSOCKET)
    *pport = cf->conn->secondary_port;
  else if(cf->conn->bits.conn_to_port)
    *pport = cf->conn->conn_to_port;
  else
    *pport = cf->conn->remote_port;

  if(*phostname != cf->conn->host.name)
    *pipv6_ip = (strchr(*phostname, ':') != NULL);
  else
    *pipv6_ip = cf->conn->bits.ipv6_ip;

  return CURLE_OK;
}